

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.hpp
# Opt level: O3

void __thiscall
so_5::subscription_bind_t::ensure_handler_can_be_used_with_mbox
          (subscription_bind_t *this,msg_type_and_handler_pair_t *handler)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  long *local_58;
  long local_48;
  long lStack_40;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (handler->m_mutability == mutable_message) {
    iVar1 = (*((this->m_mbox_ref).m_obj)->_vptr_abstract_message_box_t[6])();
    if (iVar1 == 0) {
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_38,
                 "subscription to mutable message from MPMC mbox is disabled, msg_type=","");
      plVar2 = (long *)std::__cxx11::string::append((char *)local_38);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_48 = *plVar3;
        lStack_40 = plVar2[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar3;
        local_58 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      exception_t::raise(0x2470e7);
      if (local_58 != &local_48) {
        operator_delete(local_58);
      }
      if (local_38[0] != local_28) {
        operator_delete(local_38[0]);
      }
    }
  }
  return;
}

Assistant:

inline void
subscription_bind_t::ensure_handler_can_be_used_with_mbox(
	const so_5::details::msg_type_and_handler_pair_t & handler ) const
{
	if( message_mutability_t::mutable_message == handler.m_mutability &&
			mbox_type_t::multi_producer_multi_consumer == m_mbox_ref->type() )
		SO_5_THROW_EXCEPTION( rc_subscription_to_mutable_msg_from_mpmc_mbox,
				std::string( "subscription to mutable message from MPMC mbox "
						"is disabled, msg_type=" )
				+ handler.m_msg_type.name() );
}